

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int reportComment(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  long *plVar1;
  XML_Char *s;
  long *plVar2;
  long *plVar3;
  
  if (*(long *)((long)parser + 0x88) == 0) {
    if (*(long *)((long)parser + 0xa0) == 0) {
      return 1;
    }
    reportDefault(parser,enc,start,end);
    return 1;
  }
  s = poolStoreString((STRING_POOL *)((long)parser + 0x418),enc,
                      start + (long)enc->minBytesPerChar * 4,end + (long)enc->minBytesPerChar * -3);
  if (s == (XML_Char *)0x0) {
    return 0;
  }
  normalizeLines(s);
  (**(code **)((long)parser + 0x88))(*(undefined8 *)((long)parser + 8),s);
  plVar3 = *(long **)((long)parser + 0x418);
  if (*(long **)((long)parser + 0x420) != (long *)0x0) {
    plVar1 = plVar3;
    plVar2 = *(long **)((long)parser + 0x420);
    if (plVar3 == (long *)0x0) goto LAB_004d5b6c;
    do {
      plVar3 = plVar1;
      plVar1 = (long *)*plVar3;
      *plVar3 = (long)plVar2;
      plVar2 = plVar3;
    } while (plVar1 != (long *)0x0);
  }
  *(long **)((long)parser + 0x420) = plVar3;
LAB_004d5b6c:
  *(undefined8 *)((long)parser + 0x418) = 0;
  *(undefined8 *)((long)parser + 0x428) = 0;
  *(undefined8 *)((long)parser + 0x430) = 0;
  *(undefined8 *)((long)parser + 0x438) = 0;
  return 1;
}

Assistant:

static int
reportComment(XML_Parser parser, const ENCODING *enc, const char *start, const char *end)
{
  XML_Char *data;
  if (!commentHandler) {
    if (defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  data = poolStoreString(&tempPool,
                         enc,
                         start + enc->minBytesPerChar * 4, 
                         end - enc->minBytesPerChar * 3);
  if (!data)
    return 0;
  normalizeLines(data);
  commentHandler(handlerArg, data);
  poolClear(&tempPool);
  return 1;
}